

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Vec_Int_t * Abc_NtkFanoutCounts(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  pVVar5 = (Vec_Int_t *)calloc(1,0x10);
  pVVar2 = pNtk->vObjs;
  iVar1 = pVVar2->nSize;
  uVar8 = (ulong)iVar1;
  if ((long)uVar8 < 1) {
    pVVar5->nSize = iVar1;
  }
  else {
    __s = (int *)malloc(uVar8 * 4);
    pVVar5->pArray = __s;
    if (__s == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = iVar1;
    memset(__s,0xff,uVar8 * 4);
    pVVar5->nSize = iVar1;
    ppvVar3 = pVVar2->pArray;
    uVar6 = 0;
    do {
      pvVar4 = ppvVar3[uVar6];
      if (((pvVar4 != (void *)0x0) && (uVar7 = *(uint *)((long)pvVar4 + 0x14) & 0xf, uVar7 < 8)) &&
         ((0xa4U >> uVar7 & 1) != 0)) {
        if (uVar8 <= uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar6] = *(int *)((long)pvVar4 + 0x2c);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar8);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkFanoutCounts( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vFanNums;
    Abc_Obj_t * pObj;
    int i;
    vFanNums = Vec_IntAlloc( 0 );
    Vec_IntFill( vFanNums, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) )
            Vec_IntWriteEntry( vFanNums, i, Abc_ObjFanoutNum(pObj) );
    return vFanNums;
}